

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopItemWidth(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  value_type_conflict1 *pvVar3;
  float local_14;
  ImGuiWindow *window;
  
  pIVar2 = GetCurrentWindow();
  ImVector<float>::pop_back(&(pIVar2->DC).ItemWidthStack);
  bVar1 = ImVector<float>::empty(&(pIVar2->DC).ItemWidthStack);
  if (bVar1) {
    local_14 = pIVar2->ItemWidthDefault;
  }
  else {
    pvVar3 = ImVector<float>::back(&(pIVar2->DC).ItemWidthStack);
    local_14 = *pvVar3;
  }
  (pIVar2->DC).ItemWidth = local_14;
  return;
}

Assistant:

void ImGui::PopItemWidth()
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.ItemWidthStack.pop_back();
    window->DC.ItemWidth = window->DC.ItemWidthStack.empty() ? window->ItemWidthDefault : window->DC.ItemWidthStack.back();
}